

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# grid.cpp
# Opt level: O2

void __thiscall NetworkNS::Grid::Grid(Grid *this,double Lx,double Ly,double Lz,int nx,int ny,int nz)

{
  ulong uVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  grid_cell *pgVar5;
  ulong uVar6;
  uint uVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  int iVar14;
  int iVar15;
  int iVar16;
  int *piVar17;
  int iVar18;
  int iVar19;
  int iVar20;
  int iVar21;
  int iVar22;
  uint uVar23;
  int iVar24;
  int iVar25;
  int iVar26;
  uint uVar27;
  int iVar28;
  int iVar29;
  double *pdVar30;
  ulong uVar31;
  int iVar32;
  int iVar33;
  double dVar34;
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  double dVar37;
  undefined1 auVar38 [16];
  double dVar39;
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  double dVar42;
  int local_f8;
  
  this->_vptr_Grid = (_func_int **)&PTR__Grid_0010fd38;
  this->ncellx = nx;
  this->ncelly = ny;
  this->ncellz = nz;
  iVar3 = ny * nx;
  this->ncells = iVar3 * nz;
  pgVar5 = (grid_cell *)malloc((long)(iVar3 * nz) * 0x90);
  auVar41._0_8_ = (double)nx;
  auVar41._8_8_ = (double)ny;
  this->cells = pgVar5;
  auVar40._8_8_ = Ly;
  auVar40._0_8_ = Lx;
  auVar41 = divpd(auVar40,auVar41);
  this->dlx = (double)auVar41._0_8_;
  this->dly = (double)auVar41._8_8_;
  dVar39 = auVar41._0_8_;
  dVar42 = auVar41._8_8_;
  auVar35._0_8_ = (double)nz;
  auVar38._8_8_ = 0x3ff0000000000000;
  auVar38._0_8_ = Lz;
  auVar35._8_8_ = dVar39;
  auVar41 = divpd(auVar38,auVar35);
  this->dlz = (double)auVar41._0_8_;
  this->idlx = (double)auVar41._8_8_;
  dVar37 = auVar41._0_8_;
  auVar36._8_8_ = dVar37;
  auVar36._0_8_ = dVar42;
  auVar41 = divpd(_DAT_0010b480,auVar36);
  this->idly = (double)auVar41._0_8_;
  this->idlz = (double)auVar41._8_8_;
  dVar34 = dVar42 * dVar39 * dVar37;
  this->vcell = dVar34;
  this->ivcell = 1.0 / dVar34;
  iVar9 = 0;
  uVar27 = 0;
  if (0 < nx) {
    uVar27 = nx;
  }
  uVar7 = 0;
  if (0 < ny) {
    uVar7 = ny;
  }
  iVar16 = 0;
  if (0 < nz) {
    iVar16 = nz;
  }
  iVar19 = 0;
  iVar21 = 0;
  while (iVar19 != iVar16) {
    iVar19 = iVar19 + 1;
    uVar23 = 0;
    iVar11 = iVar9;
    while (uVar23 != uVar7) {
      uVar23 = uVar23 + 1;
      pdVar30 = pgVar5[iVar21].Vec + 2;
      iVar32 = 1;
      iVar25 = iVar11;
      for (iVar13 = 0; -uVar27 != iVar13; iVar13 = iVar13 + -1) {
        ((grid_cell *)(pdVar30 + -3))->Id = iVar25;
        pdVar30[-2] = (double)iVar32 * dVar39;
        pdVar30[-1] = (double)(int)uVar23 * dVar42;
        *pdVar30 = (double)iVar19 * dVar37;
        pdVar30 = pdVar30 + 0x12;
        iVar25 = iVar25 + 1;
        iVar32 = iVar32 + 1;
      }
      iVar21 = iVar21 - iVar13;
      iVar11 = iVar11 + nx;
    }
    iVar9 = iVar9 + iVar3;
  }
  iVar9 = 0;
  local_f8 = 0;
  iVar19 = 0;
  while (iVar19 != iVar16) {
    iVar21 = 0;
    if (iVar19 < nz + -1) {
      iVar21 = iVar19 + 1;
    }
    iVar11 = iVar19 + -1;
    if (iVar19 == 0) {
      iVar11 = nz + -1;
    }
    iVar15 = iVar19 * ny;
    iVar25 = iVar3 * iVar11;
    iVar11 = iVar11 * ny;
    iVar13 = iVar3 * iVar21;
    iVar21 = iVar21 * ny;
    uVar6 = 0;
    iVar32 = iVar9;
    while (uVar6 != uVar7) {
      piVar17 = pgVar5[iVar32].neigh + 0x1a;
      iVar22 = 0;
      if ((long)uVar6 < (long)(ny + -1)) {
        iVar22 = (int)(uVar6 + 1);
      }
      iVar18 = (int)uVar6;
      iVar29 = ny + -1;
      if (uVar6 != 0) {
        iVar29 = iVar18 + -1;
      }
      iVar24 = (iVar15 + iVar18) * nx;
      iVar20 = (iVar15 + iVar22) * nx;
      iVar8 = (iVar15 + iVar29) * nx;
      iVar12 = (iVar21 + iVar18) * nx;
      iVar26 = (iVar21 + iVar22) * nx;
      iVar14 = (iVar21 + iVar29) * nx;
      iVar33 = (iVar11 + iVar18) * nx;
      iVar18 = (iVar11 + iVar22) * nx;
      iVar28 = (iVar11 + iVar29) * nx;
      uVar31 = 0;
      while (uVar27 != uVar31) {
        uVar1 = uVar31 + 1;
        iVar4 = 0;
        if ((long)uVar31 < (long)(nx + -1)) {
          iVar4 = (int)uVar1;
        }
        iVar2 = (int)uVar31;
        iVar10 = nx + -1;
        if (uVar1 != 1) {
          iVar10 = iVar2 + -1;
        }
        piVar17[-0x1a] = iVar32 + iVar2;
        piVar17[-0x19] = iVar24 + iVar4;
        piVar17[-0x18] = iVar24 + iVar10;
        piVar17[-0x17] = (iVar22 + local_f8) * nx + iVar2;
        piVar17[-0x16] = (iVar29 + local_f8) * nx + iVar2;
        piVar17[-0x15] = iVar20 + iVar4;
        piVar17[-0x14] = iVar20 + iVar10;
        piVar17[-0x13] = iVar8 + iVar4;
        piVar17[-0x12] = iVar8 + iVar10;
        piVar17[-0x11] = iVar13 + iVar2;
        piVar17[-0x10] = iVar12 + iVar4;
        piVar17[-0xf] = iVar12 + iVar10;
        piVar17[-0xe] = iVar26 + iVar2;
        piVar17[-0xd] = iVar14 + iVar2;
        piVar17[-0xc] = iVar26 + iVar4;
        piVar17[-0xb] = iVar26 + iVar10;
        piVar17[-10] = iVar14 + iVar4;
        piVar17[-9] = iVar14 + iVar10;
        piVar17[-8] = iVar25 + iVar2;
        piVar17[-7] = iVar33 + iVar4;
        piVar17[-6] = iVar33 + iVar10;
        piVar17[-5] = iVar18 + iVar2;
        piVar17[-4] = iVar2 + iVar28;
        piVar17[-3] = iVar18 + iVar4;
        piVar17[-2] = iVar18 + iVar10;
        piVar17[-1] = iVar4 + iVar28;
        *piVar17 = iVar10 + iVar28;
        piVar17 = piVar17 + 0x24;
        uVar31 = uVar1;
      }
      iVar25 = iVar25 + nx;
      iVar13 = iVar13 + nx;
      iVar32 = iVar32 + nx;
      uVar6 = uVar6 + 1;
    }
    local_f8 = local_f8 + ny;
    iVar9 = iVar9 + iVar3;
    iVar19 = iVar19 + 1;
  }
  return;
}

Assistant:

Grid::Grid(double Lx, double Ly, double Lz, int nx, int ny, int nz) {

      /* Initialize the arrays with the cells: */
      ncellx = nx;
      ncelly = ny;
      ncellz = nz;
      ncells = ncellx * ncelly * ncellz;
      cells = (grid_cell*)malloc(ncells * sizeof(grid_cell));

      /*define dlx, dly, dlz and vecell: all of these are common parameters for each subcell
       *  and thus they are defined only once*/

      dlx = Lx / double(ncellx);
      idlx = 1.0 / dlx;
      dly = Ly / double(ncelly);
      idly = 1.0 / dly;
      dlz = Lz / double(ncellz);
      idlz = 1.0 / dlz;
      vcell = dlx * dly*dlz;
      ivcell = 1.0 / vcell;

      int counter = 0;
      //define Id, and the vector of each cell

      for (int k = 0; k < ncellz; k++) 

         for (int j = 0; j < ncelly; j++) 

            for (int i = 0; i < ncellx; i++) {


               cells[counter].Id = k * ncelly * ncellx + j * ncellx + i;
               cells[counter].Vec[0] = double(i + 1) * dlx;
               cells[counter].Vec[1] = double(j + 1) * dly;
               cells[counter].Vec[2] = double(k + 1) * dlz;


              
               counter = counter + 1;
            }

         

      

      //define the first neighbours of all nodes 


      int icell, jcell, kcell, klower, kupper, jlower, jupper, ilower, iupper, c_id;

      for (kcell = 0; kcell < ncellz; kcell++) {

         kupper = kcell + 1;
         if ((kcell + 1)>(ncellz - 1)) kupper = 0;
         klower = kcell - 1;
         if ((kcell - 1) < 0) klower = ncellz - 1;

         for (jcell = 0; jcell < ncelly; jcell++) {

            jupper = jcell + 1;
            if ((jcell + 1)>(ncelly - 1)) jupper = 0;
            jlower = jcell - 1;
            if ((jcell - 1) < 0) jlower = ncelly - 1;


            for (icell = 0; icell < ncellx; icell++) {

               iupper = icell + 1;
               if ((icell + 1)>(ncellx - 1)) iupper = 0;
               ilower = icell - 1;
               if ((icell - 1) < 0) ilower = ncellx - 1;

               c_id = (kcell) * ncelly * ncellx + (jcell) * ncellx + icell;

               // 1: z, y , x:
               //neigh[cell_id][0] = (kcell)*ncelly*ncellx + (jcell)*ncellx + icell;
               cells[c_id].neigh[0] = (kcell) * ncelly * ncellx + (jcell) * ncellx + icell;
               //2: same z, same y, x+
               //neigh[cell_id][1] = (kcell)*ncelly*ncellx + (jcell)*ncellx + iupper;
               cells[c_id].neigh[1] = (kcell) * ncelly * ncellx + (jcell) * ncellx + iupper;
               // 3: same z, same y, x-
               //neigh[cell_id][2] = (kcell)*ncelly*ncellx + (jcell)*ncellx + ilower;  
               cells[c_id].neigh[2] = (kcell) * ncelly * ncellx + (jcell) * ncellx + ilower;
               //4: same z, y+ , same x
               //neigh[cell_id][3] = (kcell)*ncelly*ncellx + (jupper)*ncellx + icell; 
               cells[c_id].neigh[3] = (kcell) * ncelly * ncellx + (jupper) * ncellx + icell;
               //5: same z, y- , same x
               //neigh[cell_id][4] = (kcell)*ncelly*ncellx + (jlower)*ncellx + icell;
               cells[c_id].neigh[4] = (kcell) * ncelly * ncellx + (jlower) * ncellx + icell;
               //6: same z, y+ , x+
               //neigh[cell_id][5] = (kcell)*ncelly*ncellx + (jupper)*ncellx + iupper;
               cells[c_id].neigh[5] = (kcell) * ncelly * ncellx + (jupper) * ncellx + iupper;
               //7: same z, y+ , x-
               //neigh[cell_id][6] = (kcell)*ncelly*ncellx + (jupper)*ncellx + ilower;
               cells[c_id].neigh[6] = (kcell) * ncelly * ncellx + (jupper) * ncellx + ilower;
               //8: same z, y-, x+
               //neigh[cell_id][7] = (kcell)*ncelly*ncellx + (jlower)*ncellx + iupper;
               cells[c_id].neigh[7] = (kcell) * ncelly * ncellx + (jlower) * ncellx + iupper;
               //9: same z, y-, x-
               //neigh[cell_id][8] = (kcell)*ncelly*ncellx + (jlower)*ncellx + ilower;
               cells[c_id].neigh[8] = (kcell) * ncelly * ncellx + (jlower) * ncellx + ilower;

               //10: z+1, y, x :
               //neigh[cell_id][9] = (kupper)*ncelly*ncellx + (jcell)*ncellx + icell;
               cells[c_id].neigh[9] = (kupper) * ncelly * ncellx + (jcell) * ncellx + icell;
               //11: z+1, same y, x+
               //neigh[cell_id][10] = (kupper)*ncelly*ncellx + (jcell)*ncellx + iupper;
               cells[c_id].neigh[10] = (kupper) * ncelly * ncellx + (jcell) * ncellx + iupper;
               //12: z+1, same y, x-
               //neigh[cell_id][11] = (kupper)*ncelly*ncellx + (jcell)*ncellx + ilower;
               cells[c_id].neigh[11] = (kupper) * ncelly * ncellx + (jcell) * ncellx + ilower;
               //13: z+1, y+ , same x
               //neigh[cell_id][12] = (kupper)*ncelly*ncellx + (jupper)*ncellx + icell;
               cells[c_id].neigh[12] = (kupper) * ncelly * ncellx + (jupper) * ncellx + icell;
               //14: z+1, y- , same x
               //neigh[cell_id][13] = (kupper)*ncelly*ncellx + (jlower)*ncellx + icell;
               cells[c_id].neigh[13] = (kupper) * ncelly * ncellx + (jlower) * ncellx + icell;
               //15: z+1, y+ , x+
               //neigh[cell_id][14] = (kupper)*ncelly*ncellx + (jupper)*ncellx + iupper;
               cells[c_id].neigh[14] = (kupper) * ncelly * ncellx + (jupper) * ncellx + iupper;
               //16: z+1, y+ , x-
               //neigh[cell_id][15] = (kupper)*ncelly*ncellx + (jupper)*ncellx + ilower;
               cells[c_id].neigh[15] = (kupper) * ncelly * ncellx + (jupper) * ncellx + ilower;
               //17: z+1, y-, x+
               //neigh[cell_id][16] = (kupper)*ncelly*ncellx + (jlower)*ncellx + iupper;
               cells[c_id].neigh[16] = (kupper) * ncelly * ncellx + (jlower) * ncellx + iupper;
               //18: z+1, y-, x-
               //neigh[cell_id][17] = (kupper)*ncelly*ncellx + (jlower)*ncellx + ilower;
               cells[c_id].neigh[17] = (kupper) * ncelly * ncellx + (jlower) * ncellx + ilower;

               //19: z-1, y, x :
               //neigh[cell_id][18] = (klower)*ncelly*ncellx + (jcell)*ncellx + icell;
               cells[c_id].neigh[18] = (klower) * ncelly * ncellx + (jcell) * ncellx + icell;
               //20: z-1, same y, x+
               //neigh[cell_id][19] = (klower)*ncelly*ncellx + (jcell)*ncellx + iupper;
               cells[c_id].neigh[19] = (klower) * ncelly * ncellx + (jcell) * ncellx + iupper;
               //21: z-1, same y, x-
               //neigh[cell_id][20] = (klower)*ncelly*ncellx + (jcell)*ncellx + ilower;
               cells[c_id].neigh[20] = (klower) * ncelly * ncellx + (jcell) * ncellx + ilower;
               //22: z-1, y+ , same x
               //neigh[cell_id][21] = (klower)*ncelly*ncellx + (jupper)*ncellx + icell;
               cells[c_id].neigh[21] = (klower) * ncelly * ncellx + (jupper) * ncellx + icell;
               //23: z-1, y- , same x
               //neigh[cell_id][22] = (klower)*ncelly*ncellx + (jlower)*ncellx + icell;
               cells[c_id].neigh[22] = (klower) * ncelly * ncellx + (jlower) * ncellx + icell;
               //24: z-1, y+ , x+
               //neigh[cell_id][23] = (klower)*ncelly*ncellx + (jupper)*ncellx + iupper;
               cells[c_id].neigh[23] = (klower) * ncelly * ncellx + (jupper) * ncellx + iupper;
               //25: z-1, y+ , x-
               //neigh[cell_id][24] = (klower)*ncelly*ncellx + (jupper)*ncellx + ilower;
               cells[c_id].neigh[24] = (klower) * ncelly * ncellx + (jupper) * ncellx + ilower;
               //26: z-1, y-, x+
               //neigh[cell_id][25] = (klower)*ncelly*ncellx + (jlower)*ncellx + iupper;
               cells[c_id].neigh[25] = (klower) * ncelly * ncellx + (jlower) * ncellx + iupper;
               //27: z-1, y-, x-
               //neigh[cell_id][26] = (klower)*ncelly*ncellx + (jlower)*ncellx + ilower;
               cells[c_id].neigh[26] = (klower) * ncelly * ncellx + (jlower) * ncellx + ilower;

            }

         }

      }



   }